

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav_preinit_write(drwav *pWav,drwav_data_format *pFormat,drwav_bool32 isSequential,
                   drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData,
                   drwav_allocation_callbacks *pAllocationCallbacks)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  undefined8 in_R9;
  drwav_allocation_callbacks *in_stack_00000008;
  drwav_allocation_callbacks local_58;
  undefined8 local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  void *local_10;
  drwav_bool32 local_4;
  
  if ((in_RDI == (void *)0x0) || (in_RCX == 0)) {
    local_4 = 0;
  }
  else if ((in_EDX == 0) && (in_R8 == 0)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RSI + 4) == 0xfffe) {
    local_4 = 0;
  }
  else if ((*(int *)(in_RSI + 4) == 2) || (*(int *)(in_RSI + 4) == 0x11)) {
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RDI,0,0x1b8);
    *(long *)((long)local_10 + 8) = local_28;
    *(long *)((long)local_10 + 0x10) = local_30;
    *(undefined8 *)((long)local_10 + 0x18) = local_38;
    drwav_copy_allocation_callbacks_or_defaults(&local_58,in_stack_00000008);
    *(void **)((long)local_10 + 0x20) = local_58.pUserData;
    *(_func_void_ptr_size_t_void_ptr **)((long)local_10 + 0x28) = local_58.onMalloc;
    *(_func_void_ptr_void_ptr_size_t_void_ptr **)((long)local_10 + 0x30) = local_58.onRealloc;
    *(_func_void_void_ptr_void_ptr **)((long)local_10 + 0x38) = local_58.onFree;
    if ((*(long *)((long)local_10 + 0x38) == 0) ||
       ((*(long *)((long)local_10 + 0x28) == 0 && (*(long *)((long)local_10 + 0x30) == 0)))) {
      local_4 = 0;
    }
    else {
      *(short *)((long)local_10 + 0x44) = (short)*(undefined4 *)(local_18 + 4);
      *(short *)((long)local_10 + 0x46) = (short)*(undefined4 *)(local_18 + 8);
      *(undefined4 *)((long)local_10 + 0x48) = *(undefined4 *)(local_18 + 0xc);
      *(uint *)((long)local_10 + 0x4c) =
           (uint)(*(int *)(local_18 + 0x10) * *(int *)(local_18 + 0xc) * *(int *)(local_18 + 8)) >>
           3;
      *(short *)((long)local_10 + 0x50) =
           (short)((uint)(*(int *)(local_18 + 8) * *(int *)(local_18 + 0x10)) >> 3);
      *(short *)((long)local_10 + 0x52) = (short)*(undefined4 *)(local_18 + 0x10);
      *(undefined2 *)((long)local_10 + 0x54) = 0;
      *(int *)((long)local_10 + 0xa0) = local_1c;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static drwav_bool32 drwav_preinit_write(drwav* pWav, const drwav_data_format* pFormat, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; /* <-- onSeek is required when in non-sequential mode. */
    }

    /* Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this. */
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;

    return DRWAV_TRUE;
}